

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_matrix_zp_chain_rep.cpp
# Opt level: O3

void __thiscall
Chain_matrix_zp_rep_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
::test_method(Chain_matrix_zp_rep_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>_>
              *this)

{
  Column_zp_settings *this_00;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>
  m;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_e0;
  undefined1 local_c8 [184];
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>>>
            ();
  this_00 = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>
  ::Column_zp_settings::Column_zp_settings(this_00,5);
  local_c8._0_8_ = this_00;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>>
  ::
  Chain_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>>
              *)(local_c8 + 8),&local_e0,this_00);
  test_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>>
            ((Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>
              *)local_c8);
  Gudhi::persistence_matrix::
  Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>
  ::~Matrix((Matrix<Chain_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>
             *)local_c8);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_e0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Chain_matrix_zp_rep_representative_cycles, Matrix, full_matrices) {
  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);
  test_representative_cycles<Matrix>(m);
}